

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Inst::PrintBytes<UnifiedRegex::Char2LiteralScannerMixin>
          (Inst *this,DebugWriter *w,Inst *inst,Char2LiteralScannerMixin *that,char16 *annotation)

{
  long lVar1;
  
  DebugWriter::Print(w,L"0x%p[+0x%03x](0x%03x) [%s]:",that,(long)that - (long)inst,4,annotation);
  if (that < that + 1) {
    lVar1 = 0;
    do {
      if (lVar1 == 0) {
        DebugWriter::Print(w,L" ",(ulong)(byte)(that->super_Char2Mixin).cs[0]);
      }
      DebugWriter::Print(w,L"%02x",(ulong)*(byte *)((long)(that->super_Char2Mixin).cs + lVar1));
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
  }
  DebugWriter::PrintEOL(w,L"");
  return;
}

Assistant:

void Inst::PrintBytes(DebugWriter *w, Inst *inst, T *that, const char16 *annotation) const
    {
        T *start = (T*)that;
        byte *startByte = (byte *)start;
        byte *baseByte = (byte *)inst;
        ptrdiff_t offset = startByte - baseByte;
        size_t size = sizeof(*((T *)that));
        byte *endByte = startByte + size;
        byte *currentByte = startByte;
        w->Print(_u("0x%p[+0x%03x](0x%03x) [%s]:"), startByte, offset, size, annotation);

        for (; currentByte < endByte; ++currentByte)
        {
            if ((currentByte - endByte) % 4 == 0)
            {
                w->Print(_u(" "), *currentByte);
            }
            w->Print(_u("%02x"), *currentByte);
        }
        w->PrintEOL(_u(""));
    }